

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontdatabase.cpp
# Opt level: O1

void __thiscall QtFontStyle::Key::Key(Key *this,QString *styleString)

{
  char16_t *pcVar1;
  qsizetype originalLength;
  char cVar2;
  CutResult CVar3;
  int iVar4;
  long lVar5;
  short sVar6;
  ushort uVar7;
  storage_type_conflict *psVar8;
  QArrayData *pQVar9;
  long in_FS_OFFSET;
  QStringView QVar10;
  QStringView QVar11;
  QStringView QVar12;
  QStringView QVar13;
  QStringView QVar14;
  QStringView QVar15;
  QStringView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  QStringView QVar19;
  QStringView QVar20;
  QLatin1String QVar21;
  QLatin1String QVar22;
  QLatin1String QVar23;
  QStringView QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QStringView QVar34;
  QStringView QVar35;
  QLatin1String QVar36;
  QLatin1String QVar37;
  QLatin1String QVar38;
  QLatin1String QVar39;
  QLatin1String QVar40;
  QLatin1String QVar41;
  QLatin1String QVar42;
  QLatin1String QVar43;
  QLatin1String QVar44;
  QLatin1String QVar45;
  QLatin1String QVar46;
  QStringView QVar47;
  QLatin1String QVar48;
  QStringView QVar49;
  QStringView QVar50;
  QStringView QVar51;
  QStringView QVar52;
  QArrayData *local_f0 [3];
  QString local_d8;
  QString local_b8;
  QString local_98;
  QString local_78;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->field_0x2 = 0;
  *(undefined2 *)this = 0x640;
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLower_helper(&local_58);
  originalLength = local_58.d.size;
  if ((undefined1 *)local_58.d.size == (undefined1 *)0x6) {
    QVar10.m_data = local_58.d.ptr;
    QVar10.m_size = 6;
    QVar36.m_data = "normal";
    QVar36.m_size = 6;
    cVar2 = QtPrivate::equalStrings(QVar10,QVar36);
    sVar6 = 400;
    if (cVar2 == '\0') goto LAB_00499f0d;
  }
  else {
LAB_00499f0d:
    if ((undefined1 *)originalLength == (undefined1 *)0x7) {
      QVar11.m_data = local_58.d.ptr;
      QVar11.m_size = 7;
      QVar37.m_data = "regular";
      QVar37.m_size = 7;
      cVar2 = QtPrivate::equalStrings(QVar11,QVar37);
      sVar6 = 400;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    if ((undefined1 *)originalLength == (undefined1 *)0x4) {
      QVar12.m_data = local_58.d.ptr;
      QVar12.m_size = 4;
      QVar38.m_data = "bold";
      QVar38.m_size = 4;
      cVar2 = QtPrivate::equalStrings(QVar12,QVar38);
      sVar6 = 700;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    if ((undefined1 *)originalLength == (undefined1 *)0x8) {
      QVar13.m_data = local_58.d.ptr;
      QVar13.m_size = 8;
      QVar39.m_data = "semibold";
      QVar39.m_size = 8;
      cVar2 = QtPrivate::equalStrings(QVar13,QVar39);
      sVar6 = 600;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    if ((undefined1 *)originalLength == (undefined1 *)0x9) {
      QVar14.m_data = local_58.d.ptr;
      QVar14.m_size = 9;
      QVar40.m_data = "semi bold";
      QVar40.m_size = 9;
      cVar2 = QtPrivate::equalStrings(QVar14,QVar40);
      sVar6 = 600;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    if ((undefined1 *)originalLength == (undefined1 *)0x8) {
      QVar15.m_data = local_58.d.ptr;
      QVar15.m_size = 8;
      QVar41.m_data = "demibold";
      QVar41.m_size = 8;
      cVar2 = QtPrivate::equalStrings(QVar15,QVar41);
      sVar6 = 600;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    if ((undefined1 *)originalLength == (undefined1 *)0x9) {
      QVar16.m_data = local_58.d.ptr;
      QVar16.m_size = 9;
      QVar42.m_data = "demi bold";
      QVar42.m_size = 9;
      cVar2 = QtPrivate::equalStrings(QVar16,QVar42);
      sVar6 = 600;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    if ((undefined1 *)originalLength == (undefined1 *)0x6) {
      QVar17.m_data = local_58.d.ptr;
      QVar17.m_size = 6;
      QVar43.m_data = "medium";
      QVar43.m_size = 6;
      cVar2 = QtPrivate::equalStrings(QVar17,QVar43);
      sVar6 = 500;
      if (cVar2 != '\0') goto LAB_0049a303;
    }
    pcVar1 = local_58.d.ptr;
    if ((undefined1 *)originalLength == (undefined1 *)0x5) {
      QVar18.m_data = local_58.d.ptr;
      QVar18.m_size = 5;
      QVar44.m_data = "black";
      QVar44.m_size = 5;
      cVar2 = QtPrivate::equalStrings(QVar18,QVar44);
      sVar6 = 900;
      if (cVar2 == '\0') {
        QVar19.m_data = pcVar1;
        QVar19.m_size = 5;
        QVar45.m_data = "light";
        QVar45.m_size = 5;
        cVar2 = QtPrivate::equalStrings(QVar19,QVar45);
        sVar6 = 300;
        if (cVar2 == '\0') goto LAB_0049a0ac;
      }
    }
    else {
LAB_0049a0ac:
      if ((undefined1 *)originalLength == (undefined1 *)0x4) {
        QVar20.m_data = local_58.d.ptr;
        QVar20.m_size = 4;
        QVar46.m_data = "thin";
        QVar46.m_size = 4;
        cVar2 = QtPrivate::equalStrings(QVar20,QVar46);
        sVar6 = 100;
        if (cVar2 != '\0') goto LAB_0049a303;
      }
      pcVar1 = local_58.d.ptr;
      local_78.d.d = (Data *)0x2;
      local_98.d.d = (Data *)0xffffffffffffffff;
      CVar3 = QtPrivate::QContainerImplHelper::mid
                        (originalLength,(qsizetype *)&local_78,(qsizetype *)&local_98);
      if (CVar3 == Null) {
        pQVar9 = (QArrayData *)0x0;
        psVar8 = (storage_type_conflict *)0x0;
      }
      else {
        psVar8 = pcVar1 + (long)local_78.d.d;
        pQVar9 = &(local_98.d.d)->super_QArrayData;
      }
      QVar21.m_data = (char *)0x2;
      QVar21.m_size = (qsizetype)&local_58;
      cVar2 = QString::startsWith(QVar21,0x6c3186);
      if ((cVar2 != '\0') ||
         (QVar22.m_data = (char *)0x2, QVar22.m_size = (qsizetype)&local_58,
         cVar2 = QString::startsWith(QVar22,0x6bc04a), cVar2 != '\0')) {
        if (pQVar9 == (QArrayData *)0x8) {
          QVar23.m_data = "tralight";
          QVar23.m_size = 8;
          QVar47.m_data = psVar8;
          QVar47.m_size = 8;
          cVar2 = QtPrivate::equalStrings(QVar23,QVar47);
          sVar6 = 200;
          if (cVar2 != '\0') goto LAB_0049a303;
        }
        if ((undefined1 *)local_58.d.size == (undefined1 *)0x9) {
          QVar24.m_data = local_58.d.ptr;
          QVar24.m_size = 9;
          QVar48.m_data = "tra light";
          QVar48.m_size = 9;
          cVar2 = QtPrivate::equalStrings(QVar24,QVar48);
          sVar6 = 200;
          if (cVar2 != '\0') goto LAB_0049a303;
        }
        if (pQVar9 == (QArrayData *)0x7) {
          QVar25.m_data = "trabold";
          QVar25.m_size = 7;
          QVar49.m_data = psVar8;
          QVar49.m_size = 7;
          cVar2 = QtPrivate::equalStrings(QVar25,QVar49);
          sVar6 = 800;
          if (cVar2 != '\0') goto LAB_0049a303;
        }
        if (pQVar9 == (QArrayData *)0x8) {
          QVar26.m_data = "tra bold";
          QVar26.m_size = 8;
          QVar50.m_data = psVar8;
          QVar50.m_size = 8;
          cVar2 = QtPrivate::equalStrings(QVar26,QVar50);
          sVar6 = 800;
          if (cVar2 != '\0') goto LAB_0049a303;
        }
      }
      QVar27.m_data = (char *)0x4;
      QVar27.m_size = (qsizetype)&local_58;
      lVar5 = QString::indexOf(QVar27,0x6b782e,CaseInsensitive);
      if (lVar5 == -1) {
        QVar29.m_data = (char *)0x4;
        QVar29.m_size = (qsizetype)&local_58;
        lVar5 = QString::indexOf(QVar29,0x6b780a,CaseInsensitive);
        sVar6 = 100;
        if (lVar5 == -1) {
          QVar30.m_data = &DAT_00000005;
          QVar30.m_size = (qsizetype)&local_58;
          lVar5 = QString::indexOf(QVar30,0x6b781c,CaseInsensitive);
          sVar6 = 300;
          if (lVar5 == -1) {
            QVar31.m_data = &DAT_00000005;
            QVar31.m_size = (qsizetype)&local_58;
            lVar5 = QString::indexOf(QVar31,0x6b7804,CaseInsensitive);
            sVar6 = 900;
            if (lVar5 == -1) {
              QCoreApplication::translate((char *)&local_78,"QFontDatabase","Normal",0x6b7838);
              iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_78);
              if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                LOCK();
                ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                     ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                     + -1;
                UNLOCK();
                if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                    == 0) {
                  QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                }
              }
              if (iVar4 == 0) {
                sVar6 = 400;
              }
              else {
                local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                QCoreApplication::translate((char *)&local_98,"QFontDatabase","Bold",0);
                QString::toLower_helper(&local_78);
                if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                  }
                }
                if (local_58.d.size == local_78.d.size) {
                  QVar34.m_data = local_58.d.ptr;
                  QVar34.m_size = local_58.d.size;
                  QVar51.m_data = local_78.d.ptr;
                  QVar51.m_size = local_78.d.size;
                  cVar2 = QtPrivate::equalStrings(QVar34,QVar51);
                  sVar6 = 700;
                  if (cVar2 == '\0') goto LAB_0049a5c0;
                }
                else {
LAB_0049a5c0:
                  QCoreApplication::translate((char *)&local_98,"QFontDatabase","Demi Bold",0);
                  iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_98);
                  if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                    LOCK();
                    ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                         ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                         _M_i + -1;
                    UNLOCK();
                    if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i == 0) {
                      QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                    }
                  }
                  if (iVar4 == 0) {
                    sVar6 = 600;
                  }
                  else {
                    QCoreApplication::translate((char *)&local_98,"QFontDatabase","Medium",0x6b786b)
                    ;
                    iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_98);
                    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                      LOCK();
                      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                           = ((local_98.d.d)->super_QArrayData).ref_._q_value.
                             super___atomic_base<int>._M_i + -1;
                      UNLOCK();
                      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i == 0) {
                        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                      }
                    }
                    if (iVar4 == 0) {
                      sVar6 = 500;
                    }
                    else {
                      QCoreApplication::translate((char *)&local_98,"QFontDatabase","Black",0);
                      iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_98);
                      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                        LOCK();
                        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                        _M_i = ((local_98.d.d)->super_QArrayData).ref_._q_value.
                               super___atomic_base<int>._M_i + -1;
                        UNLOCK();
                        if (((local_98.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i == 0) {
                          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                        }
                      }
                      if (iVar4 == 0) {
                        sVar6 = 900;
                      }
                      else {
                        local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                        local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                        local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                        QCoreApplication::translate((char *)&local_b8,"QFontDatabase","Light",0);
                        QString::toLower_helper(&local_98);
                        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i = ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                        if (local_58.d.size == local_98.d.size) {
                          QVar35.m_data = local_58.d.ptr;
                          QVar35.m_size = local_58.d.size;
                          QVar52.m_data = local_98.d.ptr;
                          QVar52.m_size = local_98.d.size;
                          cVar2 = QtPrivate::equalStrings(QVar35,QVar52);
                          sVar6 = 300;
                          if (cVar2 == '\0') goto LAB_0049a77a;
                        }
                        else {
LAB_0049a77a:
                          QCoreApplication::translate((char *)&local_b8,"QFontDatabase","Thin",0);
                          iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_b8);
                          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                            LOCK();
                            ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                            super___atomic_base<int>._M_i =
                                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                            UNLOCK();
                            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i == 0) {
                              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                            }
                          }
                          if (iVar4 == 0) {
                            sVar6 = 100;
                          }
                          else {
                            QCoreApplication::translate
                                      ((char *)&local_b8,"QFontDatabase","Extra Light",0);
                            iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_b8);
                            if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                              LOCK();
                              ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i =
                                   ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                   super___atomic_base<int>._M_i + -1;
                              UNLOCK();
                              if (((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i == 0) {
                                QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                              }
                            }
                            if (iVar4 == 0) {
                              sVar6 = 200;
                            }
                            else {
                              QCoreApplication::translate
                                        ((char *)&local_b8,"QFontDatabase","Extra Bold",0);
                              iVar4 = QString::compare(&local_58,(CaseSensitivity)&local_b8);
                              if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                                LOCK();
                                ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                super___atomic_base<int>._M_i =
                                     ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int>._M_i + -1;
                                UNLOCK();
                                if (((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i == 0) {
                                  QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
                                }
                              }
                              if (iVar4 == 0) {
                                sVar6 = 800;
                              }
                              else {
                                local_b8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                                local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                                local_b8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                                QCoreApplication::translate
                                          ((char *)&local_d8,"QFontDatabase","Extra",0);
                                QString::toLower_helper(&local_b8);
                                if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                                  LOCK();
                                  ((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i =
                                       ((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                       super___atomic_base<int>._M_i + -1;
                                  UNLOCK();
                                  if (((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i == 0) {
                                    QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10)
                                    ;
                                  }
                                }
                                lVar5 = QString::indexOf(&local_58,(longlong)&local_78,
                                                         CaseInsensitive);
                                if (lVar5 == -1) {
                                  lVar5 = QString::indexOf(&local_58,(longlong)&local_98,
                                                           CaseInsensitive);
                                  if (lVar5 == -1) {
                                    sVar6 = 400;
                                  }
                                  else {
                                    lVar5 = QString::indexOf(&local_58,(longlong)&local_b8,
                                                             CaseInsensitive);
                                    sVar6 = 200;
                                    if (lVar5 == -1) {
                                      sVar6 = 300;
                                    }
                                  }
                                }
                                else {
                                  local_d8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
                                  local_d8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
                                  local_d8.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
                                  QCoreApplication::translate
                                            ((char *)local_f0,"QFontDatabase","Demi",0);
                                  QString::toLower_helper(&local_d8);
                                  if (local_f0[0] != (QArrayData *)0x0) {
                                    LOCK();
                                    (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                                         (local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i
                                         + -1;
                                    UNLOCK();
                                    if ((local_f0[0]->ref_)._q_value.super___atomic_base<int>._M_i
                                        == 0) {
                                      QArrayData::deallocate(local_f0[0],2,0x10);
                                    }
                                  }
                                  lVar5 = QString::indexOf(&local_58,(longlong)&local_d8,
                                                           CaseInsensitive);
                                  sVar6 = 600;
                                  if (lVar5 == -1) {
                                    lVar5 = QString::indexOf(&local_58,(longlong)&local_b8,
                                                             CaseInsensitive);
                                    sVar6 = 800;
                                    if (lVar5 == -1) {
                                      sVar6 = 700;
                                    }
                                  }
                                  if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                                    LOCK();
                                    ((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int>._M_i =
                                         ((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                         super___atomic_base<int>._M_i + -1;
                                    UNLOCK();
                                    if (((local_d8.d.d)->super_QArrayData).ref_._q_value.
                                        super___atomic_base<int>._M_i == 0) {
                                      QArrayData::deallocate
                                                (&(local_d8.d.d)->super_QArrayData,2,0x10);
                                    }
                                  }
                                }
                                if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
                                  LOCK();
                                  ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                  super___atomic_base<int>._M_i =
                                       ((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                       super___atomic_base<int>._M_i + -1;
                                  UNLOCK();
                                  if (((local_b8.d.d)->super_QArrayData).ref_._q_value.
                                      super___atomic_base<int>._M_i == 0) {
                                    QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10)
                                    ;
                                  }
                                }
                              }
                            }
                          }
                        }
                        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
                          LOCK();
                          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                          _M_i = ((local_98.d.d)->super_QArrayData).ref_._q_value.
                                 super___atomic_base<int>._M_i + -1;
                          UNLOCK();
                          if (((local_98.d.d)->super_QArrayData).ref_._q_value.
                              super___atomic_base<int>._M_i == 0) {
                            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
                          }
                        }
                      }
                    }
                  }
                }
                if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                      == 0) {
                    QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
                  }
                }
              }
            }
          }
        }
      }
      else {
        QVar28.m_data = (char *)0x4;
        QVar28.m_size = (qsizetype)&local_58;
        lVar5 = QString::indexOf(QVar28,0x6b7833,CaseInsensitive);
        sVar6 = 600;
        if (lVar5 == -1) {
          sVar6 = 700;
        }
      }
    }
  }
LAB_0049a303:
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  *(ushort *)this = ((ushort)*(undefined3 *)this & 0xf003) + sVar6 * 4;
  if ((styleString->d).size != 0) {
    uVar7 = 1;
    QVar32.m_data = &DAT_00000006;
    QVar32.m_size = (qsizetype)styleString;
    lVar5 = QString::indexOf(QVar32,0x6b6fb3,CaseInsensitive);
    if (lVar5 == -1) {
      QVar33.m_data = (char *)0x7;
      QVar33.m_size = (qsizetype)styleString;
      lVar5 = QString::indexOf(QVar33,0x6b6fba,CaseInsensitive);
      uVar7 = 2;
      if (lVar5 == -1) {
        QCoreApplication::translate((char *)&local_58,"QFontDatabase","Italic",0);
        uVar7 = 1;
        lVar5 = QString::indexOf(styleString,(longlong)&local_58,CaseInsensitive);
        if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (lVar5 == -1) {
          QCoreApplication::translate((char *)&local_58,"QFontDatabase","Oblique",0);
          lVar5 = QString::indexOf(styleString,(longlong)&local_58,CaseInsensitive);
          if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
            }
          }
          uVar7 = 2;
          if (lVar5 == -1) goto LAB_0049a48e;
        }
      }
    }
    *(ushort *)this = *(ushort *)this & 0xfffc | uVar7;
  }
LAB_0049a48e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QtFontStyle::Key::Key(const QString &styleString)
    : style(QFont::StyleNormal), weight(QFont::Normal), stretch(0)
{
    weight = getFontWeight(styleString);

    if (!styleString.isEmpty()) {
        // First the straightforward no-translation checks, these are fast.
        if (styleString.contains("Italic"_L1))
            style = QFont::StyleItalic;
        else if (styleString.contains("Oblique"_L1))
            style = QFont::StyleOblique;

        // Then the translation checks. These aren't as fast.
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Italic")))
            style = QFont::StyleItalic;
        else if (styleString.contains(QCoreApplication::translate("QFontDatabase", "Oblique")))
            style = QFont::StyleOblique;
    }
}